

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O3

int Bmc_PerformISearchOne
              (Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fVerbose,
              Vec_Int_t *vLits)

{
  int iVar1;
  lit *begin;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *pGia;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vRegs;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  timespec ts;
  timespec local_78;
  Cnf_Dat_t *local_68;
  ulong local_60;
  long local_58;
  int local_4c;
  int *local_48;
  Gia_Man_t *local_40;
  Gia_Man_t *local_38;
  
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0x17d,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0x17e,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  pGVar9 = Gia_ManDup(p);
  pGia = Gia_ManMiter(p,pGVar9,0,1,1,0,0);
  Gia_ManStop(pGVar9);
  if (pGia->vCos->nSize - pGia->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0x184,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  if (pGia->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0x185,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  iVar3 = 0;
  pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  s = Bmc_DeriveSolver(p,pGia,pCnf,nFramesMax,nTimeOut,iVar3);
  iVar3 = sat_solver_solve(s,vLits->pArray,vLits->pArray + vLits->nSize,0,0,0,0);
  if (iVar3 == 1) {
    printf("I = %4d :  ",(ulong)(uint)nFramesMax);
    puts("Problem is satisfiable.");
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    iVar3 = 1;
  }
  else {
    if (iVar3 == 0) {
      vRegs = (Vec_Int_t *)0x0;
      printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
             ,(ulong)(uint)nTimeOut);
      iVar3 = 1;
    }
    else {
      if (iVar3 != -1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0x1a8,
                      "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                     );
      }
      iVar3 = p->nRegs;
      uVar18 = (ulong)iVar3;
      local_68 = pCnf;
      if ((long)uVar18 < 1) {
        uVar15 = 0;
      }
      else {
        uVar11 = 0;
        uVar14 = (ulong)(uint)vLits->nSize;
        if (vLits->nSize < 1) {
          uVar14 = uVar11;
        }
        uVar15 = 0;
        do {
          if (uVar14 == uVar11) goto LAB_0059fb0b;
          if (vLits->pArray[uVar11] < 0) goto LAB_0059fb2a;
          uVar15 = uVar15 + (~vLits->pArray[uVar11] & 1U);
          uVar11 = uVar11 + 1;
        } while (uVar18 != uVar11);
      }
      vRegs = (Vec_Int_t *)malloc(0x10);
      iVar12 = 0x10;
      if (0xe < iVar3 - 1U) {
        iVar12 = iVar3;
      }
      vRegs->nCap = iVar12;
      if (iVar12 == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)malloc((long)iVar12 << 2);
      }
      vRegs->pArray = piVar10;
      vRegs->nSize = iVar3;
      auVar2 = _DAT_0093d220;
      if (0 < iVar3) {
        lVar13 = uVar18 - 1;
        auVar19._8_4_ = (int)lVar13;
        auVar19._0_8_ = lVar13;
        auVar19._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar14 = 0;
        auVar19 = auVar19 ^ _DAT_0093d220;
        auVar20 = _DAT_0093d210;
        do {
          auVar21 = auVar20 ^ auVar2;
          if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                      auVar19._4_4_ < auVar21._4_4_) & 1)) {
            piVar10[uVar14] = (int)uVar14;
          }
          if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
              auVar21._12_4_ <= auVar19._12_4_) {
            piVar10[uVar14 + 1] = (int)uVar14 + 1;
          }
          uVar14 = uVar14 + 2;
          lVar13 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 2;
          auVar20._8_8_ = lVar13 + 2;
        } while ((iVar3 + 1U & 0xfffffffe) != uVar14);
      }
      local_60 = (ulong)(uint)nFramesMax;
      if (fBackTopo != 0) {
        Bmc_PerformFindFlopOrder(p,vRegs);
        uVar18 = (ulong)(uint)vRegs->nSize;
        nFramesMax = (int)local_60;
      }
      iVar3 = (int)uVar18;
      if (1 < iVar3 && fReverse != 0) {
        piVar10 = vRegs->pArray;
        uVar14 = 0;
        iVar12 = iVar3;
        do {
          iVar12 = iVar12 + -1;
          iVar4 = piVar10[uVar14];
          piVar10[uVar14] = piVar10[iVar12];
          piVar10[iVar12] = iVar4;
          uVar14 = uVar14 + 1;
        } while ((uVar18 >> 1 & 0x7fffffff) != uVar14);
      }
      local_40 = p;
      if (0 < iVar3) {
        piVar10 = vRegs->pArray;
        local_4c = nFramesMax + 1;
        uVar14 = 0;
        local_48 = piVar10;
        local_38 = pGia;
        do {
          uVar8 = piVar10[uVar14];
          lVar13 = (long)(int)uVar8;
          if ((lVar13 < 0) || (vLits->nSize <= (int)uVar8)) goto LAB_0059fb0b;
          begin = vLits->pArray;
          uVar5 = begin[lVar13];
          if ((int)uVar5 < 0) {
LAB_0059fb2a:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((uVar5 & 1) == 0) {
            begin[lVar13] = uVar5 | 1;
            iVar3 = sat_solver_solve(s,begin,begin + vLits->nSize,0,0,0,0);
            pGVar9 = local_40;
            if (iVar3 == -1) {
              uVar15 = uVar15 - 1;
            }
            else {
              if (iVar3 != 1) {
                if (iVar3 != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                                ,0x1c8,
                                "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                               );
                }
                printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
                       ,(ulong)(uint)nTimeOut);
                iVar3 = 1;
                pCnf = local_68;
                goto LAB_0059faca;
              }
              if (vLits->nSize <= (int)uVar8) {
LAB_0059fb0b:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar5 = vLits->pArray[lVar13];
              if ((int)uVar5 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              vLits->pArray[lVar13] = uVar5 ^ 1;
            }
            if (fVerbose != 0) {
              uVar17 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) * local_4c;
              iVar3 = local_40->vCos->nSize;
              iVar12 = local_40->nRegs;
              iVar4 = sat_solver_nvars(s);
              uVar5 = sat_solver_nconflicts(s);
              iVar16 = 0x9f6ca4;
              printf("I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                     ((double)(int)uVar15 * 100.0) / (double)pGVar9->nRegs,(ulong)uVar8,
                     (ulong)uVar17,(ulong)(uint)(iVar3 + iVar12 + iVar4),(ulong)uVar5,(ulong)uVar15)
              ;
              Abc_Print(iVar16,"%s =","Time");
              iVar12 = 3;
              iVar3 = clock_gettime(3,&local_78);
              if (iVar3 < 0) {
                lVar13 = -1;
              }
              else {
                lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
              }
              Abc_Print(iVar12,"%9.2f sec\r",(double)(lVar13 - local_58) / 1000000.0);
              fflush(_stdout);
            }
          }
          uVar14 = uVar14 + 1;
        } while ((uVar18 & 0xffffffff) != uVar14);
      }
      pGVar9 = local_40;
      if (fVerbose != 0) {
        iVar6 = (int)local_60;
        iVar3 = pGia->vCos->nSize;
        iVar12 = pGia->vCis->nSize;
        iVar4 = pGia->nObjs;
        iVar16 = local_40->vCos->nSize;
        iVar1 = local_40->nRegs;
        iVar7 = sat_solver_nvars(s);
        uVar8 = sat_solver_nconflicts(s);
        printf("M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
               ((double)(int)uVar15 * 100.0) / (double)pGVar9->nRegs,local_60,
               (ulong)(uint)((~(iVar3 + iVar12) + iVar4) * (iVar6 + 1)),
               (ulong)(uint)(iVar16 + iVar1 + iVar7),(ulong)uVar8,(ulong)uVar15);
        iVar12 = 3;
        iVar3 = clock_gettime(3,&local_78);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        lVar13 = lVar13 - local_58;
        Abc_Print(iVar12,"%s =","Time");
        Abc_Print(iVar12,"%9.2f sec\n",(double)lVar13 / 1000000.0);
        fflush(_stdout);
      }
      iVar3 = 0;
      pCnf = local_68;
    }
LAB_0059faca:
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    if (vRegs->pArray != (int *)0x0) {
      free(vRegs->pArray);
    }
    free(vRegs);
  }
  return iVar3;
}

Assistant:

int Bmc_PerformISearchOne( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fVerbose, Vec_Int_t * vLits )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vRegs = NULL;
//    Vec_Int_t * vLits;
    int i, Iter, status;
    int nLitsUsed, RetValue = 0;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        //pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        //Gia_ManStop( pTemp );
        //pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pMiter, 8, 0, 0, 0, 0 );
    }
/*
    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
*/
    // derive SAT solver        
    pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_True )
    {
        printf( "I = %4d :  ", nFramesMax );
        printf( "Problem is satisfiable.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        Gia_ManStop( pMiter );
        return 1;
    }
    if ( status == l_Undef )
    {
        printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
        RetValue = 1;
        goto cleanup;
    }
    assert( status == l_False );

    // count the number of positive literals
    nLitsUsed = 0;
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            nLitsUsed++;

    // try removing variables
    vRegs = Vec_IntStartNatural( Gia_ManRegNum(p) );
    if ( fBackTopo )
        Bmc_PerformFindFlopOrder( p, vRegs );
    if ( fReverse )
        Vec_IntReverseOrder( vRegs );
//    for ( Iter = 0; Iter < Gia_ManRegNum(p); Iter++ )
    Vec_IntForEachEntry( vRegs, i, Iter )
    {
//        i = fReverse ? Gia_ManRegNum(p) - 1 - Iter : Iter;
        if ( Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            continue;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
            RetValue = 1;
            goto cleanup;
        }
        if ( status == l_True )
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        else if ( status == l_False )
            nLitsUsed--;
        else assert( 0 );
        // report the results
        //printf( "Round %d:  ", o );
        if ( fVerbose )
        {
            printf( "I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                i, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
                Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
                sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
            ABC_PRTr( "Time", Abc_Clock() - clkStart );
            fflush( stdout );
        }
    }
    // report the results
    //printf( "Round %d:  ", o );
    if ( fVerbose )
    {
        printf( "M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        fflush( stdout );
    }
cleanup:
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vRegs );
//    Vec_IntFree( vLits );
    return RetValue;
}